

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O2

void __thiscall logging_tests::LogSetup::~LogSetup(LogSetup *this)

{
  bool bVar1;
  __int_type_conflict2 _Var2;
  long lVar3;
  Logger *pLVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar4 = LogInstance();
  std::filesystem::__cxx11::path::operator=
            (&(pLVar4->m_file_path).super_path,(path *)&this->prev_log_path);
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  source_file._M_len = 0x66;
  logging_function._M_str = "~LogSetup";
  logging_function._M_len = 9;
  LogPrintFormatInternal<>
            (logging_function,source_file,0x44,ALL,Info,(ConstevalFormatString<0U>)0xb9d3a9);
  bVar1 = this->prev_print_to_file;
  pLVar4 = LogInstance();
  pLVar4->m_print_to_file = bVar1;
  _Var2 = this->prev_reopen_file;
  pLVar4 = LogInstance();
  LOCK();
  (pLVar4->m_reopen_file)._M_base._M_i = _Var2;
  UNLOCK();
  bVar1 = this->prev_log_timestamps;
  pLVar4 = LogInstance();
  pLVar4->m_log_timestamps = bVar1;
  bVar1 = this->prev_log_threadnames;
  pLVar4 = LogInstance();
  pLVar4->m_log_threadnames = bVar1;
  bVar1 = this->prev_log_sourcelocations;
  pLVar4 = LogInstance();
  pLVar4->m_log_sourcelocations = bVar1;
  pLVar4 = LogInstance();
  LOCK();
  (pLVar4->m_log_level)._M_i = this->prev_log_level;
  UNLOCK();
  pLVar4 = LogInstance();
  BCLog::Logger::SetCategoryLogLevel(pLVar4,&this->prev_category_levels);
  std::
  _Hashtable<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_BCLog::Level>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->prev_category_levels)._M_h);
  std::filesystem::__cxx11::path::~path(&(this->tmp_log_path).super_path);
  std::filesystem::__cxx11::path::~path(&(this->prev_log_path).super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    BasicTestingSetup::~BasicTestingSetup(&this->super_BasicTestingSetup);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~LogSetup()
    {
        LogInstance().m_file_path = prev_log_path;
        LogPrintf("Sentinel log to reopen log file\n");
        LogInstance().m_print_to_file = prev_print_to_file;
        LogInstance().m_reopen_file = prev_reopen_file;
        LogInstance().m_log_timestamps = prev_log_timestamps;
        LogInstance().m_log_threadnames = prev_log_threadnames;
        LogInstance().m_log_sourcelocations = prev_log_sourcelocations;
        LogInstance().SetLogLevel(prev_log_level);
        LogInstance().SetCategoryLogLevel(prev_category_levels);
    }